

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

bool __thiscall PStruct::ReadValue(PStruct *this,FArchive *ar,void *addr)

{
  bool bVar1;
  undefined8 in_RAX;
  BYTE tag;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  FArchive::operator<<(ar,&local_21);
  if (local_21 == 0xe) {
    bVar1 = ReadFields(this,ar,addr);
  }
  else {
    PType::SkipValue(ar,(uint)local_21);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool PStruct::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_Struct)
	{
		return ReadFields(ar, addr);
	}
	SkipValue(ar, tag);
	return true;
}